

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O1

VarOrConst __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
::
AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AsinId>>
          (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
           *this,CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinId>
                 *fc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  VarOrConst VVar3;
  BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinId>_>
  local_68;
  
  paVar2 = &local_68.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_68.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p;
  paVar1 = &(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p ==
      paVar1) {
    local_68.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
    _M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._8_8_ =
         *(undefined8 *)
          ((long)&(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2 + 8);
    local_68.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
         (pointer)paVar2;
  }
  else {
    local_68.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
    _M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length =
       (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length = 0;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_68.constr_.super_FunctionalConstraint.result_var_ =
       (fc->super_FunctionalConstraint).result_var_;
  local_68.constr_.super_FunctionalConstraint.ctx.value_ =
       (fc->super_FunctionalConstraint).ctx.value_;
  local_68.constr_.
  super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AsinId>._4_1_ =
       (fc->super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AsinId>).
       field_0x4;
  local_68.constr_.
  super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AsinId>.args_._M_elems
  [0] = (_Type)(fc->
               super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AsinId>).
               args_._M_elems[0];
  local_68.prepro_.lb_ = -INFINITY;
  local_68.prepro_.ub_ = INFINITY;
  local_68.prepro_.type_ = CONTINUOUS;
  local_68.prepro_.result_var_ = -1;
  local_68.converter_ =
       (FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        *)this;
  VVar3 = BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinId>_>
          ::Convert(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      paVar2) {
    operator_delete(local_68.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.
                    _M_dataplus._M_p,
                    local_68.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                    _M_allocated_capacity + 1);
  }
  VVar3._4_4_ = 0;
  return VVar3;
}

Assistant:

void RedefineVariable(int res_var, FuncConstraint&& fc) {
    assert( MPD( HasInitExpression(res_var) ) );
		auto ci_old = MPD( GetInitExpression(res_var) );
    fc.SetResultVar(res_var);
		// If this expression exists, use it.
		// TODO make sure any new context is re-converted
		// if necessary.
		auto i = MPD( MapFind(fc) );
    // TODO preprocess, try map again, and use the result.
		if (i<0)
      i = int( MPD( AddConstraint(std::move(fc)) ) );
		auto& ck = GET_CONSTRAINT_KEEPER( FuncConstraint );
    ConInfo ci{&ck, i};
    ReplaceInitExpression(res_var, ci);
    MarkAsBridged(ci_old);
  }